

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O3

void JPCommonLabel_push_word
               (JPCommonLabel *label,char *pron,char *pos,char *ctype,char *cform,int acc,
               int chain_flag)

{
  JPCommonLabelPhoneme *pJVar1;
  _JPCommonLabelWord *p_Var2;
  bool bVar3;
  int i;
  int iVar4;
  long lVar5;
  _JPCommonLabelPhoneme *p_Var6;
  _JPCommonLabelMora *p_Var7;
  char *pcVar8;
  JPCommonLabelWord *w;
  char *pcVar9;
  JPCommonLabelMora *head;
  JPCommonLabelWord *pJVar10;
  _JPCommonLabelMora *p_Var11;
  _JPCommonLabelAccentPhrase *p_Var12;
  _JPCommonLabelBreathGroup *p_Var13;
  _JPCommonLabelAccentPhrase *p_Var14;
  _JPCommonLabelBreathGroup *p_Var15;
  char cVar16;
  long lVar17;
  JPCommonLabelWord *in_stack_ffffffffffffff78;
  
  iVar4 = strcmp(pron,anon_var_dwarf_2546);
  if (iVar4 != 0) {
    iVar4 = strcmp(pron,anon_var_dwarf_1d7c);
    if (iVar4 != 0) {
      if (*pron == '\0') {
        return;
      }
      bVar3 = true;
LAB_0014c1fe:
      cVar16 = -0x1d;
      lVar5 = 0;
      do {
        if (pron[lVar5] != cVar16) {
          cVar16 = -0x1e;
          lVar5 = 0;
          goto LAB_0014c2f5;
        }
        cVar16 = anon_var_dwarf_12a3ec[lVar5 + 7];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      if ((label->phoneme_tail == (JPCommonLabelPhoneme *)0x0) || (label->short_pause_flag != 0)) {
        JPCommonLabel_push_word_cold_2();
      }
      else {
        JPCommonLabel_insert_pause(label);
        p_Var6 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
        pJVar1 = label->phoneme_tail;
        pJVar1->next = p_Var6;
        p_Var7 = (_JPCommonLabelMora *)calloc(1,0x30);
        p_Var11 = label->mora_tail;
        p_Var11->next = p_Var7;
        pcVar8 = strdup(pJVar1->phoneme);
        p_Var6->phoneme = pcVar8;
        p_Var6->prev = pJVar1;
        p_Var6->next = (_JPCommonLabelPhoneme *)0x0;
        p_Var6->up = p_Var7;
        p_Var6 = pJVar1->next;
        p_Var2 = p_Var11->up;
        pcVar8 = strdup(anon_var_dwarf_12a3ec + 6);
        p_Var7->mora = pcVar8;
        p_Var7->head = p_Var6;
        p_Var7->tail = p_Var6;
        p_Var7->prev = p_Var11;
        p_Var7->next = (_JPCommonLabelMora *)0x0;
        p_Var7->up = p_Var2;
        label->phoneme_tail = p_Var6;
        p_Var11 = p_Var11->next;
        label->mora_tail = p_Var11;
        label->word_tail->tail = p_Var11;
      }
      goto LAB_0014c518;
    }
    pJVar1 = label->phoneme_tail;
    if (pJVar1 == (JPCommonLabelPhoneme *)0x0) {
      JPCommonLabel_push_word_cold_3();
    }
    else {
      iVar4 = strcmp(pJVar1->phoneme,"pau");
      if (iVar4 == 0) {
        p_Var11 = pJVar1->prev->up;
      }
      else {
        p_Var11 = pJVar1->up;
      }
      p_Var12 = p_Var11->up->up;
      if (p_Var12->emotion == (char *)0x0) {
        pcVar8 = strdup("1");
        p_Var12->emotion = pcVar8;
      }
    }
  }
  label->short_pause_flag = 1;
  return;
  while( true ) {
    cVar16 = anon_var_dwarf_1b9c[lVar5 + 1];
    lVar5 = lVar5 + 1;
    if (lVar5 == 3) break;
LAB_0014c2f5:
    if (pron[lVar5] != cVar16) {
      lVar5 = 0;
      pcVar8 = anon_var_dwarf_12746a;
      goto LAB_0014c380;
    }
  }
  pJVar1 = label->phoneme_tail;
  if ((pJVar1 == (JPCommonLabelPhoneme *)0x0) || (bVar3)) {
    JPCommonLabel_push_word_cold_1();
  }
  else {
    pcVar8 = pJVar1->phoneme;
    lVar5 = 1;
    do {
      iVar4 = strcmp(*(char **)(&UNK_00178978 + lVar5 * 8),pcVar8);
      if (iVar4 == 0) {
        free(pcVar8);
        pcVar8 = strdup(jpcommon_unvoice_list[lVar5]);
        pJVar1->phoneme = pcVar8;
        goto LAB_0014c518;
      }
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0xb);
    fprintf(_stderr,
            "WARNING: JPCommonLabelPhoneme_convert_unvoice() in jpcommon_label.c: %s cannot be unvoiced.\n"
            ,pcVar8);
  }
LAB_0014c518:
  lVar5 = 3;
LAB_0014c751:
  pcVar8 = pron + lVar5;
  pron = pron + lVar5;
  if (*pcVar8 == '\0') {
LAB_0014c7fa:
    if (((!bVar3) && (label->phoneme_tail != (JPCommonLabelPhoneme *)0x0)) &&
       (iVar4 = strcmp(label->phoneme_tail->phoneme,"pau"), iVar4 != 0)) {
      pJVar10 = label->word_tail;
      if (label->word_head == pJVar10) {
        p_Var12 = (_JPCommonLabelAccentPhrase *)calloc(1,0x38);
        label->accent_tail = p_Var12;
        p_Var13 = (_JPCommonLabelBreathGroup *)calloc(1,0x20);
        label->breath_tail = p_Var13;
        pJVar10->up = p_Var12;
        p_Var12->accent = acc;
        p_Var12->emotion = (char *)0x0;
        p_Var12->head = pJVar10;
        p_Var12->tail = pJVar10;
        p_Var12->prev = (_JPCommonLabelAccentPhrase *)0x0;
        p_Var12->next = (_JPCommonLabelAccentPhrase *)0x0;
        p_Var12->up = p_Var13;
        p_Var13->head = p_Var12;
        p_Var13->tail = p_Var12;
        p_Var13->prev = (_JPCommonLabelBreathGroup *)0x0;
        p_Var13->next = (_JPCommonLabelBreathGroup *)0x0;
        label->accent_head = p_Var12;
        label->breath_head = p_Var13;
      }
      else if (chain_flag == 1) {
        p_Var12 = label->accent_tail;
        pJVar10->up = p_Var12;
        p_Var12->tail = pJVar10;
      }
      else {
        iVar4 = strcmp(pJVar10->prev->tail->tail->next->phoneme,"pau");
        p_Var14 = (_JPCommonLabelAccentPhrase *)calloc(1,0x38);
        p_Var12 = label->accent_tail;
        p_Var12->next = p_Var14;
        if (iVar4 == 0) {
          p_Var15 = (_JPCommonLabelBreathGroup *)calloc(1,0x20);
          p_Var13 = label->breath_tail;
          p_Var13->next = p_Var15;
          pJVar10->up = p_Var14;
          p_Var14->accent = acc;
          p_Var14->emotion = (char *)0x0;
          p_Var14->head = pJVar10;
          p_Var14->tail = pJVar10;
          p_Var14->prev = p_Var12;
          p_Var14->next = (_JPCommonLabelAccentPhrase *)0x0;
          p_Var14->up = p_Var15;
          p_Var15->head = p_Var14;
          p_Var15->tail = p_Var14;
          p_Var15->prev = p_Var13;
          p_Var15->next = (_JPCommonLabelBreathGroup *)0x0;
          label->accent_tail = p_Var14;
          label->breath_tail = p_Var15;
        }
        else {
          pJVar10->up = p_Var14;
          p_Var13 = label->breath_tail;
          p_Var14->accent = acc;
          p_Var14->emotion = (char *)0x0;
          p_Var14->head = pJVar10;
          p_Var14->tail = pJVar10;
          p_Var14->prev = p_Var12;
          p_Var14->next = (_JPCommonLabelAccentPhrase *)0x0;
          p_Var14->up = p_Var13;
          p_Var13->tail = p_Var14;
          label->accent_tail = p_Var14;
        }
      }
    }
    return;
  }
  goto LAB_0014c1fe;
LAB_0014c380:
  cVar16 = *pcVar8;
  lVar17 = 0;
  if (cVar16 == '\0') goto LAB_0014c3b3;
  do {
    if (pron[lVar17] != cVar16) goto LAB_0014c3a0;
    cVar16 = pcVar8[lVar17 + 1];
    lVar17 = lVar17 + 1;
  } while (cVar16 != '\0');
  if (lVar17 != 0xffffffff) goto LAB_0014c3b3;
LAB_0014c3a0:
  pcVar8 = jpcommon_mora_list[lVar5 + 3];
  lVar5 = lVar5 + 3;
  if (pcVar8 == (char *)0x0) {
    fprintf(_stderr,
            "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: %s is wrong mora list.\n",pron)
    ;
    goto LAB_0014c7fa;
  }
  goto LAB_0014c380;
LAB_0014c3b3:
  iVar4 = (int)lVar5;
  if (label->phoneme_tail == (JPCommonLabelPhoneme *)0x0) {
    JPCommonLabel_insert_pause(label);
    p_Var6 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
    label->phoneme_tail = p_Var6;
    head = (JPCommonLabelMora *)calloc(1,0x30);
    label->mora_tail = head;
    pJVar10 = (JPCommonLabelWord *)calloc(1,0x48);
    label->word_tail = pJVar10;
    pcVar9 = strdup(jpcommon_mora_list[iVar4 + 1]);
    p_Var6->phoneme = pcVar9;
    p_Var6->prev = (_JPCommonLabelPhoneme *)0x0;
    p_Var6->next = (_JPCommonLabelPhoneme *)0x0;
    p_Var6->up = head;
    pcVar8 = strdup(pcVar8);
    head->mora = pcVar8;
    head->head = p_Var6;
    head->tail = p_Var6;
    head->prev = (_JPCommonLabelMora *)0x0;
    head->next = (_JPCommonLabelMora *)0x0;
    head->up = pJVar10;
    JPCommonLabelWord_initialize
              (pJVar10,pron,pos,ctype,cform,head,head,(JPCommonLabelWord *)0x0,
               in_stack_ffffffffffffff78);
    label->phoneme_head = label->phoneme_tail;
    label->mora_head = label->mora_tail;
    label->word_head = label->word_tail;
  }
  else {
    JPCommonLabel_insert_pause(label);
    p_Var6 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
    pJVar1 = label->phoneme_tail;
    pJVar1->next = p_Var6;
    p_Var7 = (_JPCommonLabelMora *)calloc(1,0x30);
    p_Var11 = label->mora_tail;
    p_Var11->next = p_Var7;
    if (bVar3) {
      w = (JPCommonLabelWord *)calloc(1,0x48);
      pJVar10 = label->word_tail;
      pJVar10->next = w;
      pcVar9 = strdup(jpcommon_mora_list[iVar4 + 1]);
      p_Var6->phoneme = pcVar9;
      p_Var6->prev = pJVar1;
      p_Var6->next = (_JPCommonLabelPhoneme *)0x0;
      p_Var6->up = p_Var7;
      p_Var6 = pJVar1->next;
      pcVar8 = strdup(pcVar8);
      p_Var7->mora = pcVar8;
      p_Var7->head = p_Var6;
      p_Var7->tail = p_Var6;
      p_Var7->prev = p_Var11;
      p_Var7->next = (_JPCommonLabelMora *)0x0;
      p_Var7->up = w;
      JPCommonLabelWord_initialize
                (w,pron,pos,ctype,cform,p_Var11->next,p_Var11->next,pJVar10,
                 in_stack_ffffffffffffff78);
      label->phoneme_tail = label->phoneme_tail->next;
      label->mora_tail = label->mora_tail->next;
      label->word_tail = label->word_tail->next;
    }
    else {
      pcVar9 = strdup(jpcommon_mora_list[iVar4 + 1]);
      p_Var6->phoneme = pcVar9;
      p_Var6->prev = pJVar1;
      p_Var6->next = (_JPCommonLabelPhoneme *)0x0;
      p_Var6->up = p_Var7;
      p_Var6 = pJVar1->next;
      p_Var2 = p_Var11->up;
      pcVar8 = strdup(pcVar8);
      p_Var7->mora = pcVar8;
      p_Var7->head = p_Var6;
      p_Var7->tail = p_Var6;
      p_Var7->prev = p_Var11;
      p_Var7->next = (_JPCommonLabelMora *)0x0;
      p_Var7->up = p_Var2;
      label->phoneme_tail = p_Var6;
      p_Var11 = p_Var11->next;
      label->mora_tail = p_Var11;
      label->word_tail->tail = p_Var11;
    }
  }
  pcVar8 = jpcommon_mora_list[iVar4 + 2];
  if (pcVar8 != (char *)0x0) {
    JPCommonLabel_insert_pause(label);
    p_Var6 = (_JPCommonLabelPhoneme *)calloc(1,0x20);
    pJVar1 = label->phoneme_tail;
    pJVar1->next = p_Var6;
    p_Var11 = label->mora_tail;
    pcVar8 = strdup(pcVar8);
    p_Var6->phoneme = pcVar8;
    p_Var6->prev = pJVar1;
    p_Var6->next = (_JPCommonLabelPhoneme *)0x0;
    p_Var6->up = p_Var11;
    p_Var6 = pJVar1->next;
    label->phoneme_tail = p_Var6;
    p_Var11->tail = p_Var6;
  }
  lVar5 = (long)(int)lVar17;
  bVar3 = false;
  goto LAB_0014c751;
}

Assistant:

void JPCommonLabel_push_word(JPCommonLabel * label, const char *pron, const char *pos,
                             const char *ctype, const char *cform, int acc, int chain_flag)
{
   int i;
   int find;
   int is_first_word = 1;

   if (strcmp(pron, JPCOMMON_MORA_SHORT_PAUSE) == 0) {
      label->short_pause_flag = 1;
      return;
   }

   /* set emotion flag */
   if (strcmp(pron, JPCOMMON_MORA_QUESTION) == 0) {
      if (label->phoneme_tail != NULL) {
         if (strcmp(label->phoneme_tail->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0) {
            if (label->phoneme_tail->prev->up->up->up->emotion == NULL)
               label->phoneme_tail->prev->up->up->up->emotion = strdup(JPCOMMON_FLAG_QUESTION);
         } else {
            if (label->phoneme_tail->up->up->up->emotion == NULL)
               label->phoneme_tail->up->up->up->emotion = strdup(JPCOMMON_FLAG_QUESTION);
         }
      } else {
         fprintf(stderr,
                 "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be question flag.\n");
      }
      label->short_pause_flag = 1;
      return;
   }

   /* analysis pron */
   while (pron[0] != '\0') {
      find = strtopcmp(pron, JPCOMMON_MORA_LONG_VOWEL);
      if (find != -1) {
         /* for long vowel */
         if (label->phoneme_tail != NULL && label->short_pause_flag == 0) {
            JPCommonLabel_insert_pause(label);
            label->phoneme_tail->next =
                (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
            label->mora_tail->next = (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
            JPCommonLabelPhoneme_initialize(label->phoneme_tail->next, label->phoneme_tail->phoneme,
                                            label->phoneme_tail, NULL, label->mora_tail->next);
            JPCommonLabelMora_initialize(label->mora_tail->next, JPCOMMON_MORA_LONG_VOWEL,
                                         label->phoneme_tail->next, label->phoneme_tail->next,
                                         label->mora_tail, NULL, label->mora_tail->up);
            label->phoneme_tail = label->phoneme_tail->next;
            label->mora_tail = label->mora_tail->next;
            label->word_tail->tail = label->mora_tail;
         } else {
            fprintf(stderr,
                    "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be long vowel symbol.\n");
         }
         pron += find;
      } else {
         find = strtopcmp(pron, JPCOMMON_MORA_UNVOICE);
         if (find != -1) {
            /* for unvoice */
            if (label->phoneme_tail != NULL && is_first_word != 1)
               JPCommonLabelPhoneme_convert_unvoice(label->phoneme_tail);
            else
               fprintf(stderr,
                       "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: First mora should not be unvoice flag.\n");
            pron += find;
         } else {
            /* for normal word */
            for (i = 0; jpcommon_mora_list[i] != NULL; i += 3) {
               find = strtopcmp(pron, jpcommon_mora_list[i]);
               if (find != -1)
                  break;
            }
            if (find != -1) {
               if (label->phoneme_tail == NULL) {
                  JPCommonLabel_insert_pause(label);
                  label->phoneme_tail =
                      (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                  label->mora_tail = (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                  label->word_tail = (JPCommonLabelWord *) calloc(1, sizeof(JPCommonLabelWord));
                  JPCommonLabelPhoneme_initialize(label->phoneme_tail, jpcommon_mora_list[i + 1],
                                                  NULL, NULL, label->mora_tail);
                  JPCommonLabelMora_initialize(label->mora_tail, jpcommon_mora_list[i],
                                               label->phoneme_tail, label->phoneme_tail, NULL, NULL,
                                               label->word_tail);
                  JPCommonLabelWord_initialize(label->word_tail, pron, pos, ctype, cform,
                                               label->mora_tail, label->mora_tail, NULL, NULL);
                  label->phoneme_head = label->phoneme_tail;
                  label->mora_head = label->mora_tail;
                  label->word_head = label->word_tail;
                  is_first_word = 0;
               } else {
                  if (is_first_word == 1) {
                     JPCommonLabel_insert_pause(label);
                     label->phoneme_tail->next =
                         (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                     label->mora_tail->next =
                         (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                     label->word_tail->next =
                         (JPCommonLabelWord *) calloc(1, sizeof(JPCommonLabelWord));
                     JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                     jpcommon_mora_list[i + 1], label->phoneme_tail,
                                                     NULL, label->mora_tail->next);
                     JPCommonLabelMora_initialize(label->mora_tail->next, jpcommon_mora_list[i],
                                                  label->phoneme_tail->next,
                                                  label->phoneme_tail->next, label->mora_tail, NULL,
                                                  label->word_tail->next);
                     JPCommonLabelWord_initialize(label->word_tail->next, pron, pos, ctype, cform,
                                                  label->mora_tail->next, label->mora_tail->next,
                                                  label->word_tail, NULL);
                     label->phoneme_tail = label->phoneme_tail->next;
                     label->mora_tail = label->mora_tail->next;
                     label->word_tail = label->word_tail->next;
                     is_first_word = 0;
                  } else {
                     JPCommonLabel_insert_pause(label);
                     label->phoneme_tail->next =
                         (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                     label->mora_tail->next =
                         (JPCommonLabelMora *) calloc(1, sizeof(JPCommonLabelMora));
                     JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                     jpcommon_mora_list[i + 1], label->phoneme_tail,
                                                     NULL, label->mora_tail->next);
                     JPCommonLabelMora_initialize(label->mora_tail->next, jpcommon_mora_list[i],
                                                  label->phoneme_tail->next,
                                                  label->phoneme_tail->next, label->mora_tail, NULL,
                                                  label->mora_tail->up);
                     label->phoneme_tail = label->phoneme_tail->next;
                     label->mora_tail = label->mora_tail->next;
                     label->word_tail->tail = label->mora_tail;
                  }
               }
               if (jpcommon_mora_list[i + 2] != NULL) {
                  JPCommonLabel_insert_pause(label);
                  label->phoneme_tail->next =
                      (JPCommonLabelPhoneme *) calloc(1, sizeof(JPCommonLabelPhoneme));
                  JPCommonLabelPhoneme_initialize(label->phoneme_tail->next,
                                                  jpcommon_mora_list[i + 2], label->phoneme_tail,
                                                  NULL, label->mora_tail);
                  label->phoneme_tail = label->phoneme_tail->next;
                  label->mora_tail->tail = label->phoneme_tail;
               }
               pron += find;
            } else {
               fprintf(stderr,
                       "WARNING: JPCommonLabel_push_word() in jpcommon_label.c: %s is wrong mora list.\n",
                       pron);
               break;
            }
         }
      }
   }

   /* check */
   if (is_first_word == 1)
      return;
   if (label->phoneme_tail == NULL)
      return;
   if (strcmp(label->phoneme_tail->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0)
      return;

   /* make accent, phrase */
   if (label->word_head == label->word_tail) {
      /* first word */
      label->accent_tail =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));

      label->breath_tail = (JPCommonLabelBreathGroup *) calloc(1, sizeof(JPCommonLabelBreathGroup));
      label->word_tail->up = label->accent_tail;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail, acc, NULL, label->word_tail,
                                           label->word_tail, NULL, NULL, label->breath_tail);
      JPCommonLabelBreathGroup_initialize(label->breath_tail, label->accent_tail,
                                          label->accent_tail, NULL, NULL);
      label->accent_head = label->accent_tail;
      label->breath_head = label->breath_tail;
   } else if (chain_flag == 1) {
      /* common accent phrase and common phrase */
      label->word_tail->up = label->accent_tail;
      label->accent_tail->tail = label->word_tail;
   } else
       if (strcmp(label->word_tail->prev->tail->tail->next->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE)
           != 0) {
      /* different accent phrase && common phrase */
      label->accent_tail->next =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));
      label->word_tail->up = label->accent_tail->next;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail->next, acc, NULL, label->word_tail,
                                           label->word_tail, label->accent_tail, NULL,
                                           label->breath_tail);
      label->breath_tail->tail = label->accent_tail->next;
      label->accent_tail = label->accent_tail->next;
   } else {
      /* different accent phrase && different phrase */
      label->accent_tail->next =
          (JPCommonLabelAccentPhrase *) calloc(1, sizeof(JPCommonLabelAccentPhrase));
      label->breath_tail->next =
          (JPCommonLabelBreathGroup *) calloc(1, sizeof(JPCommonLabelBreathGroup));
      label->word_tail->up = label->accent_tail->next;
      JPCommonLabelAccentPhrase_initialize(label->accent_tail->next, acc, NULL, label->word_tail,
                                           label->word_tail, label->accent_tail, NULL,
                                           label->breath_tail->next);
      JPCommonLabelBreathGroup_initialize(label->breath_tail->next, label->accent_tail->next,
                                          label->accent_tail->next, label->breath_tail, NULL);
      label->accent_tail = label->accent_tail->next;
      label->breath_tail = label->breath_tail->next;
   }
}